

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,Repeat<char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_14UL> *params_3,ArrayPtr<const_char> *params_4,StringPtr *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          FixedArray<char,_1UL> *params_8)

{
  size_t size;
  char *target;
  Repeat<char> *first;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_1;
  CappedArray<char,_14UL> *rest_2;
  ArrayPtr<const_char> *rest_3;
  StringPtr *rest_4;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  FixedArray<char,_1UL> *rest_7;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  _ *local_60;
  undefined8 local_58;
  undefined1 local_49;
  CappedArray<char,_14UL> *local_48;
  ArrayPtr<const_char> *params_local_4;
  CappedArray<char,_14UL> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  Repeat<char> *params_local;
  String *result;
  
  local_49 = 0;
  local_48 = params_3;
  params_local_4 = params_2;
  params_local_3 = (CappedArray<char,_14UL> *)params_1;
  params_local_2 = (ArrayPtr<const_char> *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (Repeat<char> *)__return_storage_ptr__;
  local_a8 = Repeat<char>::size((Repeat<char> *)this);
  local_a0 = ArrayPtr<const_char>::size(params_local_2);
  local_98 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_3);
  local_90 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_local_4);
  local_88 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_48);
  local_80 = StringPtr::size((StringPtr *)params_4);
  local_78 = ArrayPtr<const_char>::size(&params_5->content);
  local_70 = ArrayPtr<const_char>::size(params_6);
  local_68 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_7);
  local_60 = (_ *)&local_a8;
  local_58 = 9;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x9;
  size = sum(local_60,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::Repeat<char>>((NoInfer<kj::Repeat<char>_> *)params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_3);
  rest_2 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_48);
  rest_4 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>(&params_5->content);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  rest_7 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_7);
  fill<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (target,first,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}